

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall
amrex::AmrLevel::FillCoarsePatch
          (AmrLevel *this,MultiFab *mf,int dcomp,Real time,int idx,int scomp,int ncomp,int nghost)

{
  BoxArray *this_00;
  Geometry *a_geom;
  IntVect *pIVar1;
  Box *pBVar2;
  int *piVar3;
  int i_00;
  int nvar;
  pointer pSVar4;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> amrlevel;
  element_type *peVar5;
  undefined8 uVar6;
  bool bVar7;
  int i;
  StateDescriptor *this_01;
  long lVar8;
  long lVar9;
  DistributionMapping *dm;
  InterpBase *mapper;
  IndexSpace *pIVar10;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs;
  ulong uVar11;
  StateData *this_02;
  long lVar12;
  uint uVar13;
  initializer_list<int> __l;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> smf;
  int iStack_310;
  Vector<double,_std::allocator<double>_> stime;
  Box domain_g;
  IntVect local_260;
  unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_> cfactory;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> ranges;
  BoxArray crseBA;
  MultiFab crseMF;
  
  this_01 = DescriptorList::operator[]((DescriptorList *)desc_lst,idx);
  lVar8 = (long)idx;
  pSVar4 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  amrlevel.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->parent->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[(long)this->level + -1]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  pBVar2 = &pSVar4[lVar8].domain;
  uVar6 = *(undefined8 *)((pBVar2->smallend).vect + 2);
  pIVar1 = &pSVar4[lVar8].domain.bigend;
  domain_g.bigend.vect[1] = (int)((ulong)*(undefined8 *)pIVar1->vect >> 0x20);
  domain_g._20_8_ = *(undefined8 *)(pIVar1->vect + 2);
  domain_g.smallend.vect._0_8_ = *(undefined8 *)(pBVar2->smallend).vect;
  domain_g.smallend.vect[2] = (int)uVar6;
  domain_g.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
  lVar9 = 0;
  do {
    if (*(char *)((long)(this->geom).super_CoordSys.inv_dx + lVar9 + 0x19) == '\x01') {
      piVar3 = domain_g.smallend.vect + lVar9;
      *piVar3 = *piVar3 - nghost;
      piVar3 = domain_g.bigend.vect + lVar9;
      *piVar3 = *piVar3 + nghost;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  StateDescriptor::sameInterps(&ranges,this_01,scomp,ncomp);
  if (0 < (int)((ulong)((long)ranges.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)ranges.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    dm = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
    a_geom = (Geometry *)
             ((long)amrlevel.
                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x10);
    pIVar1 = &this->crse_ratio;
    lVar9 = 0;
    do {
      i_00 = ranges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar9].first;
      nvar = ranges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar9].second;
      mapper = StateDescriptor::interp(this_01,i_00);
      peVar5 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      BoxArray::BoxArray(&crseBA,((long)(peVar5->m_abox).
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  *(long *)&(peVar5->m_abox).
                                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                            ._M_impl.super__Vector_impl_data >> 2) *
                                 0x6db6db6db6db6db7);
      uVar13 = (int)((long)((crseBA.m_ref.
                             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)((crseBA.m_ref.
                             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2) * -0x49249249;
      if (0 < (int)uVar13) {
        lVar12 = 0;
        uVar11 = 0;
        do {
          BATransformer::operator()
                    ((Box *)&smf,&this_00->m_bat,
                     (Box *)(*(long *)&(((mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                         boxarray.m_ref.
                                         super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_abox).
                                       super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                       _M_impl.super__Vector_impl_data + lVar12));
          crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
               (int)smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start - nghost;
          if ((int)crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase <=
              domain_g.smallend.vect[0]) {
            crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                 domain_g.smallend.vect[0];
          }
          crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
               smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_ - nghost;
          if (smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ - nghost <= domain_g.smallend.vect[1]) {
            crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
                 domain_g.smallend.vect[1];
          }
          crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
               (int)smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - nghost;
          if ((int)smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_finish - nghost <= domain_g.smallend.vect[2]) {
            crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                 domain_g.smallend.vect[2];
          }
          crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType
          .m_typ.itype = (BATindexType)
                         (smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_ + nghost);
          if (domain_g.bigend.vect[0] <=
              smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ + nghost) {
            crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
            m_indexType.m_typ.itype = (BATindexType)domain_g.bigend.vect[0];
          }
          crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
          m_typ.itype = (IndexType)
                        ((int)smf.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + nghost);
          if (domain_g.bigend.vect[1] <=
              (int)smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + nghost) {
            crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
            m_bndryReg.m_typ.itype = (IndexType)domain_g.bigend.vect[1];
          }
          crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
          m_crse_ratio.vect[0] =
               smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + nghost;
          if (domain_g.bigend.vect[2] <=
              smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ + nghost) {
            crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
            m_bndryReg.m_crse_ratio.vect[0] = domain_g.bigend.vect[2];
          }
          crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
          m_crse_ratio.vect[1] = iStack_310;
          (*mapper->_vptr_InterpBase[3])((MFInfo *)&smf,mapper,&crseMF,pIVar1);
          BoxArray::set(&crseBA,(int)uVar11,(Box *)&smf);
          uVar11 = uVar11 + 1;
          lVar12 = lVar12 + 0x1c;
        } while ((uVar13 & 0x7fffffff) != uVar11);
      }
      MultiFab::MultiFab(&crseMF);
      pIVar10 = EB2::TopIndexSpaceIfPresent();
      if (pIVar10 == (IndexSpace *)0x0) {
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x1;
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        stime.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)&PTR__FabFactory_0074e8d0;
        MultiFab::define(&crseMF,&crseBA,dm,nvar,0,(MFInfo *)&smf,
                         (FabFactory<amrex::FArrayBox> *)&stime);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        stime.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        stime.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)stime.super_vector<double,_std::allocator<double>_>.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish & 0xffffffff00000000);
        __l._M_len = 3;
        __l._M_array = (iterator)&stime;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&smf,__l,(allocator_type *)&local_260);
        makeEBFabFactory((amrex *)&cfactory,a_geom,&crseBA,dm,
                         (Vector<int,_std::allocator<int>_> *)&smf,basic);
        if (smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)smf.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)smf.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x1;
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        MultiFab::define(&crseMF,&crseBA,dm,nvar,0,(MFInfo *)&smf,
                         (FabFactory<amrex::FArrayBox> *)
                         cfactory._M_t.
                         super___uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                         .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>._M_head_impl);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((__uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
             )cfactory._M_t.
              super___uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
              .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
             )0x0) {
          (**(code **)(*(long *)cfactory._M_t.
                                super___uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                                .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>.
                                _M_head_impl + 8))();
        }
      }
      iStack_310 = 0;
      if ((long)this->level == 1) {
LAB_004f782c:
        this_02 = (StateData *)
                  (*(long *)&(((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                              ((long)amrlevel.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                     .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                              0x170))->
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>).
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + lVar8 * 0xe0);
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        stime.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        stime.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        stime.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        StateData::getData(this_02,&smf,&stime,time);
        StateDataPhysBCFunct::StateDataPhysBCFunct
                  ((StateDataPhysBCFunct *)&cfactory,this_02,i_00,a_geom);
        FabArray<amrex::FArrayBox>::setDomainBndry<amrex::FArrayBox,_0>
                  (&crseMF.super_FabArray<amrex::FArrayBox>,NAN,0,
                   crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,a_geom);
        local_260.vect[0] =
             crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0];
        local_260.vect[1] =
             crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[1];
        local_260.vect[2] =
             crseMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[2];
        FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                  (&crseMF,&local_260,time,&smf,&stime,i_00,0,nvar,a_geom,
                   (StateDataPhysBCFunct *)&cfactory,i_00);
        if (stime.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(stime.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)stime.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)stime.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)smf.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)smf.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        uVar13 = 0;
        switch((this_00->m_bat).m_bat_type) {
        case null:
        case coarsenRatio:
          break;
        case indexType:
        case indexType_coarsenRatio:
          uVar13 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                   m_indexType.m_typ.itype;
          break;
        default:
          uVar13 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                   m_bndryReg.m_typ.itype;
        }
        smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(smf.
                               super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar13);
        bVar7 = ProperlyNested<amrex::InterpBase>
                          (pIVar1,(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.
                                  blocking_factor.
                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                  ._M_impl.super__Vector_impl_data._M_start + this->level,nghost,
                           (IndexType *)&smf,mapper);
        if (bVar7) goto LAB_004f782c;
        FillPatch((AmrLevel *)
                  amrlevel.
                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&crseMF,0,time,idx,
                  i_00,nvar,0);
      }
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44(nghost,nghost);
      smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(smf.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                             .
                             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,nghost);
      bcs = StateDescriptor::getBCs(this_01);
      FillPatchInterp<amrex::MultiFab>
                (mf,dcomp,&crseMF,0,nvar,(IntVect *)&smf,a_geom,&this->geom,&domain_g,pIVar1,mapper,
                 bcs,i_00);
      if (0 < nghost) {
        StateDataPhysBCFunct::StateDataPhysBCFunct
                  ((StateDataPhysBCFunct *)&smf,
                   (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8,i_00,&this->geom);
        stime.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = *(pointer *)(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
        stime.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(stime.super_vector<double,_std::allocator<double>_>.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish._4_4_,
                                      (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                      n_grow.vect[2]);
        StateDataPhysBCFunct::operator()
                  ((StateDataPhysBCFunct *)&smf,mf,dcomp,nvar,(IntVect *)&stime,time,i_00);
      }
      dcomp = dcomp + nvar;
      MultiFab::~MultiFab(&crseMF);
      BoxArray::~BoxArray(&crseBA);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)((ulong)((long)ranges.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)ranges.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (ranges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(ranges.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)ranges.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)ranges.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
AmrLevel::FillCoarsePatch (MultiFab& mf,
                           int       dcomp,
                           Real      time,
                           int       idx,
                           int       scomp,
                           int       ncomp,
                           int       nghost)
{
    BL_PROFILE("AmrLevel::FillCoarsePatch()");

    //
    // Must fill this region on crse level and interpolate.
    //
    BL_ASSERT(level != 0);
    BL_ASSERT(ncomp <= (mf.nComp()-dcomp));
    BL_ASSERT(nghost <= mf.nGrow());
    BL_ASSERT(0 <= idx && idx < desc_lst.size());

    int                     DComp   = dcomp;
    const StateDescriptor&  desc    = desc_lst[idx];
    const Box&              pdomain = state[idx].getDomain();
    const BoxArray&         mf_BA   = mf.boxArray();
    const DistributionMapping& mf_DM = mf.DistributionMap();
    AmrLevel&               clev    = parent->getLevel(level-1);
    const Geometry&         cgeom   = clev.geom;

    Box domain_g = pdomain;
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (geom.isPeriodic(i)) {
            domain_g.grow(i,nghost);
        }
    }

    std::vector< std::pair<int,int> > ranges  = desc.sameInterps(scomp,ncomp);

    BL_ASSERT(desc.inRange(scomp, ncomp));

    for (int i = 0; i < static_cast<int>(ranges.size()); i++)
    {
        const int     SComp  = ranges[i].first;
        const int     NComp  = ranges[i].second;
        InterpBase*   mapper = desc.interp(SComp);

        BoxArray crseBA(mf_BA.size());

        for (int j = 0, N = crseBA.size(); j < N; ++j)
        {
            BL_ASSERT(mf_BA[j].ixType() == desc.getType());
            const Box& bx = amrex::grow(mf_BA[j],nghost) & domain_g;
            crseBA.set(j,mapper->CoarseBox(bx, crse_ratio));
        }

        MultiFab crseMF;
#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            auto cfactory = makeEBFabFactory(cgeom, crseBA, mf_DM, {0,0,0}, EBSupport::basic);
            crseMF.define(crseBA,mf_DM,NComp,0,MFInfo(),*cfactory);
        } else
#endif
        {
            crseMF.define(crseBA,mf_DM,NComp,0);
        }

        if ( level == 1
             || amrex::ProperlyNested(crse_ratio, parent->blockingFactor(level),
                                      nghost, mf_BA.ixType(), mapper) )
        {
            StateData& statedata = clev.state[idx];

            Vector<MultiFab*> smf;
            Vector<Real> stime;
            statedata.getData(smf,stime,time);

            StateDataPhysBCFunct physbcf(statedata,SComp,cgeom);

            crseMF.setDomainBndry(std::numeric_limits<Real>::quiet_NaN(), cgeom);
            amrex::FillPatchSingleLevel(crseMF,time,smf,stime,SComp,0,NComp,cgeom,physbcf,SComp);
        }
        else
        {
            FillPatch(clev,crseMF,0,time,idx,SComp,NComp,0);
        }

        FillPatchInterp(mf, DComp, crseMF, 0, NComp, IntVect(nghost), cgeom, geom, domain_g,
                        crse_ratio, mapper, desc.getBCs(), SComp);

        if (nghost > 0) {
            StateDataPhysBCFunct physbcf(state[idx],SComp,geom);
            physbcf.FillBoundary(mf, DComp, NComp, mf.nGrowVect(), time, SComp);
        }

        DComp += NComp;
    }
}